

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::anon_unknown_0::PortConnectionBuilder::PortConnectionBuilder
          (PortConnectionBuilder *this,InstanceSymbol *instance,
          SeparatedSyntaxList<slang::syntax::PortConnectionSyntax> *portConnections)

{
  undefined8 uVar1;
  undefined4 uVar2;
  Token TVar3;
  bool bVar4;
  Scope *pSVar5;
  Compilation *pCVar6;
  Diagnostic *pDVar7;
  NamedPortConnectionSyntax *pNVar8;
  SourceLocation SVar9;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>
  *ppVar10;
  Symbol *pSVar11;
  InstanceArraySymbol *this_00;
  iterator __first;
  iterator __last;
  bool bVar12;
  LookupLocation LVar13;
  const_iterator cVar14;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> sVar15;
  SourceRange SVar16;
  string_view sVar17;
  pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool> pVar18;
  pair<ska::detailv3::sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>_>,_8UL>_>::templated_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>_>,_bool>
  pVar19;
  bool local_241;
  InstanceArraySymbol *sym;
  Scope *parent;
  Diagnostic *diag_1;
  bool local_169;
  NamedPortConnectionSyntax *local_168;
  pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool> local_160;
  templated_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>_>
  local_150;
  pair<ska::detailv3::sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>_>,_8UL>_>::templated_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>_>,_bool>
  pair;
  string_view name;
  NamedPortConnectionSyntax *npc;
  Diagnostic *diag;
  bool local_99;
  Token local_98;
  SourceLocation local_88;
  DiagCode local_80;
  bool local_79;
  PortConnectionSyntax *pPStack_78;
  bool isOrdered;
  PortConnectionSyntax *conn;
  const_iterator __end3;
  const_iterator __begin3;
  SeparatedSyntaxList<slang::syntax::PortConnectionSyntax> *__range3;
  bool hasConnections;
  SeparatedSyntaxList<slang::syntax::PortConnectionSyntax> *portConnections_local;
  InstanceSymbol *instance_local;
  PortConnectionBuilder *this_local;
  
  pSVar5 = Symbol::getParentScope((Symbol *)instance);
  this->scope = pSVar5;
  this->instance = instance;
  pCVar6 = Scope::getCompilation(this->scope);
  this->comp = pCVar6;
  SmallVector<slang::ConstantRange,_4UL>::SmallVector(&this->instanceDims);
  SmallVector<const_slang::syntax::PortConnectionSyntax_*,_5UL>::SmallVector(&this->orderedConns);
  SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>,_8UL,_ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>_>,_8UL>_>
  ::SmallMap(&this->namedConns);
  nonstd::span_lite::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>::
  span<true,_0>(&this->wildcardAttrs);
  LVar13 = LookupLocation::after((Symbol *)instance);
  (this->lookupLocation).index = LVar13.index;
  (this->lookupLocation).scope = LVar13.scope;
  SourceRange::SourceRange(&this->wildcardRange);
  this->orderedIndex = 0;
  this->usingOrdered = true;
  this->hasWildcard = false;
  this->warnedAboutUnnamed = false;
  this->unnamedRefError = false;
  bVar12 = false;
  cVar14 = slang::syntax::SeparatedSyntaxList<slang::syntax::PortConnectionSyntax>::begin
                     (portConnections);
  __end3.index = (size_t)cVar14.list;
  cVar14 = slang::syntax::SeparatedSyntaxList<slang::syntax::PortConnectionSyntax>::end
                     (portConnections);
  do {
    __end3.list = (ParentList *)cVar14.index;
    conn = (PortConnectionSyntax *)cVar14.list;
    bVar4 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PortConnectionSyntax>::iterator_base<const_slang::syntax::PortConnectionSyntax_*>,_std::random_access_iterator_tag,_const_slang::syntax::PortConnectionSyntax_*,_unsigned_long,_const_slang::syntax::PortConnectionSyntax_**,_const_slang::syntax::PortConnectionSyntax_*&>
            ::operator!=((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PortConnectionSyntax>::iterator_base<const_slang::syntax::PortConnectionSyntax_*>,_std::random_access_iterator_tag,_const_slang::syntax::PortConnectionSyntax_*,_unsigned_long,_const_slang::syntax::PortConnectionSyntax_**,_const_slang::syntax::PortConnectionSyntax_*&>
                          *)&__end3.index,
                         (iterator_base<const_slang::syntax::PortConnectionSyntax_*> *)&conn);
    TVar3.info = local_98.info;
    TVar3.kind = local_98.kind;
    TVar3._2_1_ = local_98._2_1_;
    TVar3.numFlags.raw = local_98.numFlags.raw;
    TVar3.rawLen = local_98.rawLen;
    if (!bVar4) {
LAB_002fcac8:
      sym = (InstanceArraySymbol *)this->scope;
      local_98 = TVar3;
      while( true ) {
        bVar12 = false;
        if (sym != (InstanceArraySymbol *)0x0) {
          pSVar11 = Scope::asSymbol((Scope *)sym);
          bVar12 = pSVar11->kind == InstanceArray;
        }
        if (!bVar12) break;
        pSVar11 = Scope::asSymbol((Scope *)sym);
        this_00 = Symbol::as<slang::ast::InstanceArraySymbol>(pSVar11);
        SmallVectorBase<slang::ConstantRange>::push_back
                  (&(this->instanceDims).super_SmallVectorBase<slang::ConstantRange>,&this_00->range
                  );
        sym = (InstanceArraySymbol *)Symbol::getParentScope(&this_00->super_Symbol);
      }
      __first = SmallVectorBase<slang::ConstantRange>::begin
                          (&(this->instanceDims).super_SmallVectorBase<slang::ConstantRange>);
      __last = SmallVectorBase<slang::ConstantRange>::end
                         (&(this->instanceDims).super_SmallVectorBase<slang::ConstantRange>);
      std::reverse<slang::ConstantRange*>(__first,__last);
      return;
    }
    pPStack_78 = slang::syntax::SeparatedSyntaxList<slang::syntax::PortConnectionSyntax>::
                 iterator_base<const_slang::syntax::PortConnectionSyntax_*>::operator*
                           ((iterator_base<const_slang::syntax::PortConnectionSyntax_*> *)
                            &__end3.index);
    local_241 = true;
    if ((pPStack_78->super_SyntaxNode).kind != OrderedPortConnection) {
      local_241 = (pPStack_78->super_SyntaxNode).kind == EmptyPortConnection;
    }
    local_79 = local_241;
    if (bVar12) {
      if (local_241 != (bool)(this->usingOrdered & 1U)) {
        pSVar5 = this->scope;
        local_80.subsystem = Declarations;
        local_80.code = 0x62;
        local_98 = slang::syntax::SyntaxNode::getFirstToken(&pPStack_78->super_SyntaxNode);
        local_88 = parsing::Token::location(&local_98);
        Scope::addDiag(pSVar5,local_80,local_88);
        TVar3 = local_98;
        goto LAB_002fcac8;
      }
    }
    else {
      bVar12 = true;
      this->usingOrdered = local_241;
    }
    if (local_241 == false) {
      if ((pPStack_78->super_SyntaxNode).kind == WildcardPortConnection) {
        local_99 = true;
        bVar4 = std::exchange<bool,bool>(&this->hasWildcard,&local_99);
        if (((bVar4 ^ 0xffU) & 1) == 0) {
          pSVar5 = this->scope;
          SVar16 = slang::syntax::SyntaxNode::sourceRange(&pPStack_78->super_SyntaxNode);
          pDVar7 = Scope::addDiag(pSVar5,(DiagCode)0x200006,SVar16);
          Diagnostic::addNote(pDVar7,(DiagCode)0xa0001,this->wildcardRange);
        }
        else {
          SVar16 = slang::syntax::SyntaxNode::sourceRange(&pPStack_78->super_SyntaxNode);
          this->wildcardRange = SVar16;
          syntax = slang::syntax::SyntaxList::operator_cast_to_span
                             ((SyntaxList *)&pPStack_78->attributes);
          uVar1 = (this->lookupLocation).scope;
          uVar2 = (this->lookupLocation).index;
          LVar13.index = uVar2;
          LVar13.scope = (Scope *)uVar1;
          LVar13._12_4_ = 0;
          sVar15 = AttributeSymbol::fromSyntax(syntax,this->scope,LVar13);
          this->wildcardAttrs = sVar15;
        }
      }
      else {
        pNVar8 = slang::syntax::SyntaxNode::as<slang::syntax::NamedPortConnectionSyntax>
                           (&pPStack_78->super_SyntaxNode);
        sVar17 = parsing::Token::valueText(&pNVar8->name);
        pair._8_8_ = sVar17._M_len;
        bVar4 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                          ((basic_string_view<char,_std::char_traits<char>_> *)&pair.second);
        if (!bVar4) {
          local_169 = false;
          local_168 = pNVar8;
          pVar18 = std::make_pair<slang::syntax::NamedPortConnectionSyntax_const*,bool>
                             (&local_168,&local_169);
          local_160.first = pVar18.first;
          local_160.second = pVar18.second;
          pVar19 = ska::detailv3::
                   sherwood_v3_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedPortConnectionSyntax_const*,bool>>,std::basic_string_view<char,std::char_traits<char>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedPortConnectionSyntax_const*,bool>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedPortConnectionSyntax_const*,bool>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedPortConnectionSyntax_const*,bool>>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedPortConnectionSyntax_const*,bool>>>,8ul>>
                   ::
                   emplace<std::basic_string_view<char,std::char_traits<char>>&,std::pair<slang::syntax::NamedPortConnectionSyntax_const*,bool>>
                             ((sherwood_v3_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedPortConnectionSyntax_const*,bool>>,std::basic_string_view<char,std::char_traits<char>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedPortConnectionSyntax_const*,bool>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedPortConnectionSyntax_const*,bool>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedPortConnectionSyntax_const*,bool>>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedPortConnectionSyntax_const*,bool>>>,8ul>>
                               *)&(this->namedConns).
                                  super_flat_hash_map<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>,_std::hash<basic_string_view<char,_char_traits<char>_>_>,_std::equal_to<basic_string_view<char,_char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>_>,_8UL>_>
                              ,(basic_string_view<char,_std::char_traits<char>_> *)&pair.second,
                              &local_160);
          local_150 = pVar19.first.current;
          pair.first.current._0_1_ = pVar19.second;
          if (((undefined1  [16])pVar19 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            pSVar5 = this->scope;
            SVar9 = parsing::Token::location(&pNVar8->name);
            pDVar7 = Scope::addDiag(pSVar5,(DiagCode)0x1f0006,SVar9);
            sVar17._M_str = sVar17._M_str;
            sVar17._M_len = pair._8_8_;
            Diagnostic::operator<<(pDVar7,sVar17);
            ppVar10 = ska::detailv3::
                      sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>_>,_8UL>_>
                      ::
                      templated_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>_>
                      ::operator->(&local_150);
            SVar9 = parsing::Token::location(&((ppVar10->second).first)->name);
            Diagnostic::addNote(pDVar7,(DiagCode)0xa0001,SVar9);
          }
        }
      }
    }
    else {
      SmallVectorBase<const_slang::syntax::PortConnectionSyntax_*>::push_back
                (&(this->orderedConns).
                  super_SmallVectorBase<const_slang::syntax::PortConnectionSyntax_*>,
                 &stack0xffffffffffffff88);
    }
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PortConnectionSyntax>::iterator_base<const_slang::syntax::PortConnectionSyntax_*>,_std::random_access_iterator_tag,_const_slang::syntax::PortConnectionSyntax_*,_unsigned_long,_const_slang::syntax::PortConnectionSyntax_**,_const_slang::syntax::PortConnectionSyntax_*&>
    ::operator++((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PortConnectionSyntax>::iterator_base<const_slang::syntax::PortConnectionSyntax_*>,_std::random_access_iterator_tag,_const_slang::syntax::PortConnectionSyntax_*,_unsigned_long,_const_slang::syntax::PortConnectionSyntax_**,_const_slang::syntax::PortConnectionSyntax_*&>
                  *)&__end3.index);
    cVar14.index = (size_t)__end3.list;
    cVar14.list = (ParentList *)conn;
  } while( true );
}

Assistant:

PortConnectionBuilder(const InstanceSymbol& instance,
                          const SeparatedSyntaxList<PortConnectionSyntax>& portConnections) :
        scope(*instance.getParentScope()),
        instance(instance), comp(scope.getCompilation()),
        lookupLocation(LookupLocation::after(instance)) {

        bool hasConnections = false;
        for (auto conn : portConnections) {
            bool isOrdered = conn->kind == SyntaxKind::OrderedPortConnection ||
                             conn->kind == SyntaxKind::EmptyPortConnection;
            if (!hasConnections) {
                hasConnections = true;
                usingOrdered = isOrdered;
            }
            else if (isOrdered != usingOrdered) {
                scope.addDiag(diag::MixingOrderedAndNamedPorts, conn->getFirstToken().location());
                break;
            }

            if (isOrdered) {
                orderedConns.push_back(conn);
            }
            else if (conn->kind == SyntaxKind::WildcardPortConnection) {
                if (!std::exchange(hasWildcard, true)) {
                    wildcardRange = conn->sourceRange();
                    wildcardAttrs = AttributeSymbol::fromSyntax(conn->attributes, scope,
                                                                lookupLocation);
                }
                else {
                    auto& diag = scope.addDiag(diag::DuplicateWildcardPortConnection,
                                               conn->sourceRange());
                    diag.addNote(diag::NotePreviousUsage, wildcardRange);
                }
            }
            else {
                auto& npc = conn->as<NamedPortConnectionSyntax>();
                auto name = npc.name.valueText();
                if (!name.empty()) {
                    auto pair = namedConns.emplace(name, std::make_pair(&npc, false));
                    if (!pair.second) {
                        auto& diag = scope.addDiag(diag::DuplicatePortConnection,
                                                   npc.name.location());
                        diag << name;
                        diag.addNote(diag::NotePreviousUsage,
                                     pair.first->second.first->name.location());
                    }
                }
            }
        }

        // Build up the set of dimensions for the instantiating instance's array parent, if any.
        // This builds up the dimensions in reverse order, so we have to reverse them back.
        auto parent = &scope;
        while (parent && parent->asSymbol().kind == SymbolKind::InstanceArray) {
            auto& sym = parent->asSymbol().as<InstanceArraySymbol>();
            instanceDims.push_back(sym.range);
            parent = sym.getParentScope();
        }
        std::reverse(instanceDims.begin(), instanceDims.end());
    }